

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O1

Matrix<double,__1,_1,_0,__1,_1> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
lazyAssign<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>
          (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *this,
          DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *other)

{
  undefined8 *puVar1;
  long lVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  Index innerSize;
  undefined8 *puVar6;
  Index inner;
  ulong uVar7;
  Index row;
  long lVar8;
  
  lVar8 = *(long *)(other + 8);
  lVar2 = *(long *)(other + 0x10);
  if ((lVar2 != 0 && lVar8 != 0) &&
     (auVar4 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar4 / SEXT816(lVar2),0) < lVar8)) {
    puVar6 = (undefined8 *)__cxa_allocate_exception(8,lVar2,SUB168(auVar4 % SEXT816(lVar2),0));
    *puVar6 = operator_delete;
    __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  if (lVar2 != 1 && lVar8 != 1) {
    __assert_fail("other.rows() == 1 || other.cols() == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zonotopes[P]zono_cpp/Eigen/src/Core/PlainObjectBase.h"
                  ,0x147,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resizeLike(const EigenBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::Block<Eigen::Matrix<double, -1, -1>>]"
                 );
  }
  PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,lVar2 * lVar8,1);
  uVar3 = *(ulong *)(this + 8);
  if ((uVar3 == *(ulong *)(other + 8)) && (*(long *)(other + 0x10) == 1)) {
    uVar7 = uVar3 & 0xfffffffffffffffe;
    if (0 < (long)uVar7) {
      lVar8 = 0;
      do {
        puVar6 = (undefined8 *)(*(long *)other + lVar8 * 8);
        uVar5 = puVar6[1];
        puVar1 = (undefined8 *)(*(long *)this + lVar8 * 8);
        *puVar1 = *puVar6;
        puVar1[1] = uVar5;
        lVar8 = lVar8 + 2;
      } while (lVar8 < (long)uVar7);
    }
    if (uVar7 != uVar3) {
      lVar8 = *(long *)other;
      lVar2 = *(long *)this;
      do {
        *(undefined8 *)(lVar2 + uVar7 * 8) = *(undefined8 *)(lVar8 + uVar7 * 8);
        uVar7 = uVar7 + 1;
      } while ((long)uVar7 < (long)uVar3);
    }
    return (Matrix<double,__1,_1,_0,__1,_1> *)this;
  }
  __assert_fail("rows() == other.rows() && cols() == other.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zonotopes[P]zono_cpp/Eigen/src/Core/Assign.h"
                ,0x1f2,
                "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::Block<Eigen::Matrix<double, -1, -1>>]"
               );
}

Assistant:

EIGEN_STRONG_INLINE Derived& lazyAssign(const DenseBase<OtherDerived>& other)
    {
      _resize_to_match(other);
      return Base::lazyAssign(other.derived());
    }